

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::EnableDisableAttributeErrorsTest::iterate
          (EnableDisableAttributeErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  undefined4 extraout_var;
  char *description;
  byte bVar10;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint vao;
  GLint max_attributes;
  int local_3c;
  byte local_35;
  int local_34;
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    local_34 = 8;
    local_3c = 0;
    (**(code **)(lVar9 + 0x868))(0x8869);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x109d);
    (**(code **)(lVar9 + 0x410))(1,&local_3c);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x10a1);
    iVar7 = 0;
    do {
      iVar7 = iVar7 + 1;
      cVar3 = (**(code **)(lVar9 + 0xcd8))(iVar7);
    } while (cVar3 != '\0');
    (**(code **)(lVar9 + 0x600))(0,iVar7);
    bVar1 = CheckError(this,0x502,
                       "INVALID_OPERATION was not generated by EnableVertexArrayAttrib if vaobj is not the name of an existing vertex array object."
                      );
    (**(code **)(lVar9 + 0x508))(0,iVar7);
    local_35 = CheckError(this,0x502,
                          "INVALID_OPERATION was not generated by DisableVertexArrayAttrib if vaobj is not the name of an existing vertex array object."
                         );
    (**(code **)(lVar9 + 0x600))(local_34,local_3c);
    bVar2 = CheckError(this,0x502,
                       "INVALID_VALUE was not generated by EnableVertexArrayAttrib if index is equal to MAX_VERTEX_ATTRIBS."
                      );
    (**(code **)(lVar9 + 0x508))(local_34,local_3c);
    bVar4 = CheckError(this,0x502,
                       "INVALID_VALUE was not generated by DisableVertexArrayAttrib if index is equal to MAX_VERTEX_ATTRIBS."
                      );
    (**(code **)(lVar9 + 0x600))(local_34 + 1,local_3c);
    bVar5 = CheckError(this,0x502,
                       "INVALID_VALUE was not generated by EnableVertexArrayAttrib if index is greater than MAX_VERTEX_ATTRIBS."
                      );
    (**(code **)(lVar9 + 0x508))(local_34 + 1,local_3c);
    bVar6 = CheckError(this,0x502,
                       "INVALID_VALUE was not generated by DisableVertexArrayAttrib if index is greater than MAX_VERTEX_ATTRIBS."
                      );
    bVar10 = bVar1 & local_35;
    if (local_3c != 0) {
      (**(code **)(lVar9 + 0x490))(1);
    }
    do {
      iVar7 = (**(code **)(lVar9 + 0x800))();
    } while (iVar7 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar10 & bVar2 & bVar4 & bVar5 & bVar6) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult EnableDisableAttributeErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test objects. */
	glw::GLint max_attributes = 8;

	/* Tested VAOs. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;
	try
	{
		/* Query limits. */
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS, &max_attributes);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		/* Prepare valid VAO. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;

		/* Test not a VAO. */
		gl.enableVertexArrayAttrib(0, not_a_vao);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by EnableVertexArrayAttrib if "
												  "vaobj is not the name of an existing vertex array object.");

		gl.disableVertexArrayAttrib(0, not_a_vao);

		is_ok &= CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION was not generated by DisableVertexArrayAttrib if "
												  "vaobj is not the name of an existing vertex array object.");

		/* Test to big attribute index. */
		gl.enableVertexArrayAttrib(max_attributes, vao);

		is_ok &= CheckError(
			GL_INVALID_OPERATION,
			"INVALID_VALUE was not generated by EnableVertexArrayAttrib if index is equal to MAX_VERTEX_ATTRIBS.");

		gl.disableVertexArrayAttrib(max_attributes, vao);

		is_ok &= CheckError(
			GL_INVALID_OPERATION,
			"INVALID_VALUE was not generated by DisableVertexArrayAttrib if index is equal to MAX_VERTEX_ATTRIBS.");

		gl.enableVertexArrayAttrib(max_attributes + 1, vao);

		is_ok &= CheckError(
			GL_INVALID_OPERATION,
			"INVALID_VALUE was not generated by EnableVertexArrayAttrib if index is greater than MAX_VERTEX_ATTRIBS.");

		gl.disableVertexArrayAttrib(max_attributes + 1, vao);

		is_ok &= CheckError(
			GL_INVALID_OPERATION,
			"INVALID_VALUE was not generated by DisableVertexArrayAttrib if index is greater than MAX_VERTEX_ATTRIBS.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}